

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  DataKey *pDVar2;
  uint *puVar3;
  char cVar4;
  undefined8 uVar5;
  SPxOut *pSVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined1 auVar11 [16];
  NameSet *pNVar12;
  NameSet *this_01;
  bool bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  size_t sVar19;
  pointer pnVar20;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar21;
  int __c;
  long in_FS_OFFSET;
  double dVar22;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rset;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  Verbosity old_verbosity;
  char colname [256];
  undefined1 local_6a8 [16];
  int *local_698;
  uint uStack_690;
  undefined3 uStack_68b;
  uint local_688;
  undefined3 uStack_683;
  int local_680;
  bool local_67c;
  undefined8 local_678;
  undefined1 local_668 [16];
  int *local_658;
  undefined5 uStack_650;
  undefined3 uStack_64b;
  uint local_648 [3];
  bool local_63c;
  undefined8 local_638;
  NameSet *local_630;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_628;
  undefined8 uStack_620;
  NameSet *local_610;
  double local_608;
  undefined8 uStack_600;
  DIdxSet *local_5f0;
  undefined1 local_5e8 [16];
  int *local_5d8;
  uint uStack_5d0;
  undefined3 uStack_5cb;
  uint local_5c8 [3];
  bool local_5bc;
  undefined8 local_5b8;
  uint local_5b0 [2];
  uint auStack_5a8 [2];
  uint local_5a0 [2];
  uint auStack_598 [2];
  uint local_590 [2];
  int local_588;
  bool local_584;
  undefined8 local_580;
  _func_int **local_578;
  int iStack_570;
  int iStack_56c;
  int *local_568;
  uint auStack_560 [2];
  uint local_558 [2];
  int local_550;
  bool local_54c;
  fpclass_type local_548;
  int32_t iStack_544;
  undefined **local_540 [3];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_528;
  SPxOut *local_4e8;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4e0;
  undefined1 local_4d8 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4d0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c0;
  NameSet *local_4b8;
  NameSet *local_4b0;
  undefined1 local_4a8 [24];
  uint auStack_490 [2];
  uint local_488 [2];
  int local_480;
  bool local_47c;
  fpclass_type local_478;
  int32_t iStack_474;
  DataKey local_470;
  uint auStack_468 [2];
  int *local_460;
  uint auStack_458 [2];
  uint local_450 [2];
  int local_448;
  bool local_444;
  fpclass_type local_440;
  int32_t iStack_43c;
  undefined **local_400;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3e8;
  undefined1 local_3a9;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [304];
  char *pcStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  char local_238;
  char local_138 [256];
  undefined2 local_38;
  int local_34;
  
  local_5f0 = p_intvars;
  local_4b8 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_630 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_630,1);
    p_cnames = local_630;
    NameSet::NameSet(local_630,10000,-1,2.0,2.0);
  }
  local_630 = p_cnames;
  NameSet::clear(p_cnames);
  local_4b0 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_610 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_610,1);
    p_rnames = local_610;
    NameSet::NameSet(local_610,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_610 = p_rnames;
  NameSet::clear(p_rnames);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_4e0 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_390._0_8_ = &PTR__MPSInput_0069d4f8;
  local_390._8_4_ = NAME;
  local_390._24_4_ = 0;
  local_390._28_4_ = MINIMIZE;
  local_390[0x20] = false;
  local_390[0x21] = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138[0] = '\0';
  stack0xfffffffffffffd98 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = '\0';
  local_390._16_8_ = p_input;
  MPSreadName((MPSInput *)local_390,this->spxout);
  if (local_390._8_4_ == OBJSEN) {
    MPSreadObjsen((MPSInput *)local_390);
  }
  if (local_390._8_4_ == OBJNAME) {
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    if ((!bVar13) || (pcStack_260 == (char *)0x0)) {
LAB_0021f378:
      MPSInput::syntaxError((MPSInput *)local_390);
      goto LAB_0021f38c;
    }
    spxSnprintf(local_138,0x100,"%s");
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    if ((!bVar13) ||
       (((char *)local_390._296_8_ == (char *)0x0 ||
        (iVar14 = strcmp((char *)local_390._296_8_,"ROWS"), iVar14 != 0)))) goto LAB_0021f378;
    local_390._8_4_ = ROWS;
  }
  else {
LAB_0021f38c:
    if (local_390._8_4_ != ROWS) goto LAB_0021f831;
  }
  pNVar12 = local_610;
  local_4e8 = this->spxout;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_4a8,0);
  local_628 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)(in_FS_OFFSET + -8);
  uStack_620 = 0;
  local_608 = -(double)local_628;
  uStack_600 = 0x8000000000000000;
  while (bVar13 = MPSInput::readLine((MPSInput *)local_390), pSVar6 = local_4e8, bVar13) {
    if ((char *)local_390._296_8_ != (char *)0x0) {
      if ((local_4e8 != (SPxOut *)0x0) && (3 < (int)local_4e8->m_verbosity)) {
        local_5e8._0_4_ = local_4e8->m_verbosity;
        local_6a8._0_4_ = 4;
        (*local_4e8->_vptr_SPxOut[2])(local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
        poVar7 = pSVar6->m_streams[pSVar6->m_verbosity];
        sVar19 = strlen(local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_138,sVar19);
        cVar4 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_5e8);
      }
      iVar14 = strcmp((char *)local_390._296_8_,"COLUMNS");
      if (iVar14 == 0) {
        local_390._8_4_ = COLUMNS;
        goto LAB_0021f810;
      }
      break;
    }
    if ((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) break;
    if (*pcStack_260 == 'N') {
      if (local_138[0] == '\0') {
        spxSnprintf(local_138,0x100,"%s");
      }
    }
    else {
      local_5e8._0_8_ = local_258._0_8_;
      pcVar17 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                          (&pNVar12->hashtab,(char *)local_5e8,__c);
      if (-1 < (int)pcVar17) break;
      NameSet::add(pNVar12,(char *)local_258._0_8_);
      cVar4 = *pcStack_260;
      if (cVar4 == 'E') {
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
        local_480 = pcVar18->exp;
        local_47c = pcVar18->neg;
        local_4a8._0_4_ = (pcVar18->data)._M_elems[0];
        local_4a8._4_4_ = (pcVar18->data)._M_elems[1];
        local_4a8._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
        local_4a8._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
        auStack_490 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
        local_488 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
        local_478 = pcVar18->fpclass;
        iStack_474 = pcVar18->prec_elem;
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
LAB_0021f6c2:
        local_448 = pcVar18->exp;
        local_444 = pcVar18->neg;
        local_440 = pcVar18->fpclass;
        iStack_43c = pcVar18->prec_elem;
        local_470.info = (pcVar18->data)._M_elems[0];
        local_470.idx = (pcVar18->data)._M_elems[1];
        auStack_468 = *(uint (*) [2])((pcVar18->data)._M_elems + 2);
        local_460 = *(int **)((pcVar18->data)._M_elems + 4);
        auStack_458 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
        local_450 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
      }
      else {
        if (cVar4 == 'L') {
          ::soplex::infinity::__tls_init();
          local_5b8._0_4_ = cpp_dec_float_finite;
          local_5b8._4_4_ = 10;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (int *)0x0;
          uStack_5d0._0_1_ = false;
          stack0xfffffffffffffa31 = 0;
          uStack_5cb = 0;
          local_5c8[0] = 0;
          local_5c8[1] = 0;
          local_5c8[2] = 0;
          local_5bc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_5e8,local_608);
          local_488[0] = local_5c8[0];
          local_488[1] = local_5c8[1];
          auStack_490[1]._1_3_ = uStack_5cb;
          auStack_490[0]._0_1_ = uStack_5d0._0_1_;
          auStack_490._1_4_ = stack0xfffffffffffffa31;
          local_4a8._16_8_ = local_5d8;
          local_4a8._0_8_ = local_5e8._0_8_;
          local_4a8._8_8_ = local_5e8._8_8_;
          local_480 = local_5c8[2];
          local_47c = local_5bc;
          local_478 = (fpclass_type)local_5b8;
          iStack_474 = local_5b8._4_4_;
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          goto LAB_0021f6c2;
        }
        if (cVar4 != 'G') break;
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
        local_480 = pcVar18->exp;
        local_47c = pcVar18->neg;
        local_4a8._0_4_ = (pcVar18->data)._M_elems[0];
        local_4a8._4_4_ = (pcVar18->data)._M_elems[1];
        local_4a8._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
        local_4a8._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
        auStack_490 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
        local_488 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
        local_478 = pcVar18->fpclass;
        iStack_474 = pcVar18->prec_elem;
        ::soplex::infinity::__tls_init();
        local_5b8._0_4_ = cpp_dec_float_finite;
        local_5b8._4_4_ = 10;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (int *)0x0;
        uStack_5d0._0_1_ = false;
        stack0xfffffffffffffa31 = 0;
        uStack_5cb = 0;
        local_5c8[0] = 0;
        local_5c8[1] = 0;
        local_5c8[2] = 0;
        local_5bc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_5e8,(double)local_628);
        local_450[0] = local_5c8[0];
        local_450[1] = local_5c8[1];
        auStack_458[1]._1_3_ = uStack_5cb;
        auStack_458[0]._0_1_ = uStack_5d0._0_1_;
        auStack_458._1_4_ = stack0xfffffffffffffa31;
        local_460 = local_5d8;
        local_470.info = local_5e8._0_4_;
        local_470.idx = local_5e8._4_4_;
        auStack_468[0] = local_5e8._8_4_;
        auStack_468[1] = local_5e8._12_4_;
        local_448 = local_5c8[2];
        local_444 = local_5bc;
        local_440 = (fpclass_type)local_5b8;
        iStack_43c = local_5b8._4_4_;
      }
      local_5e8._0_8_ = 0xffffffff00000000;
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(DataKey *)local_5e8,
            (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)local_4a8);
    }
  }
  MPSInput::syntaxError((MPSInput *)local_390);
LAB_0021f810:
  local_400 = &PTR__DSVectorBase_006a0f40;
  if (local_3e8 !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_3e8);
  }
LAB_0021f831:
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  this_01 = local_610;
  pNVar12 = local_630;
  if (local_390._8_4_ == COLUMNS) {
    iVar14 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_638._0_4_ = cpp_dec_float_finite;
    local_638._4_4_ = 10;
    local_668 = (undefined1  [16])0x0;
    local_658 = (int *)0x0;
    uStack_650._0_1_ = false;
    uStack_650._1_4_ = 0;
    uStack_64b = 0;
    local_648[0] = 0;
    local_648[1] = 0;
    local_648[2] = 0;
    local_63c = false;
    memset((DataKey *)local_4a8,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_5e8,iVar14);
    local_4d0.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    local_4d0.memsize = 0;
    local_4d0.memused = 0;
    local_4d8 = (undefined1  [8])&PTR__DSVectorBase_006a0f40;
    local_4c0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_4d8,8);
    pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
    local_550 = pcVar18->exp;
    local_54c = pcVar18->neg;
    local_548 = pcVar18->fpclass;
    iStack_544 = pcVar18->prec_elem;
    local_578 = *(_func_int ***)(pcVar18->data)._M_elems;
    iStack_570 = (pcVar18->data)._M_elems[2];
    iStack_56c = (pcVar18->data)._M_elems[3];
    local_568 = *(int **)((pcVar18->data)._M_elems + 4);
    auStack_560 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
    local_558 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
    local_4d0.memused = 0;
    local_608 = *(double *)(in_FS_OFFSET + -8);
LAB_0021f951:
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar13) {
      if ((char *)local_390._296_8_ != (char *)0x0) {
        iVar14 = strcmp((char *)local_390._296_8_,"RHS");
        if (iVar14 == 0) {
          if (local_4a8[0] != '\0') {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)local_540,&local_4d0);
            local_6a8._0_8_ = 0xffffffff00000000;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_4e0,(DataKey *)local_6a8,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_5e8);
          }
          local_390._8_4_ = RHS;
          goto LAB_0021ff56;
        }
        goto LAB_0021ff42;
      }
      pcVar17 = pcStack_260;
      if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0021ff42;
      iVar14 = strcmp((char *)local_4a8,pcStack_260);
      if (iVar14 != 0) {
        if (local_4a8[0] != '\0') {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)local_540,&local_4d0);
          local_6a8._0_8_ = 0xffffffff00000000;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_4e0,(DataKey *)local_6a8,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_5e8);
          pcVar17 = pcStack_260;
        }
        spxSnprintf((char *)local_4a8,0xff,"%s",pcVar17);
        local_3a9 = 0;
        iVar14 = (pNVar12->set).thesize;
        NameSet::add(pNVar12,(char *)local_4a8);
        if ((pNVar12->set).thesize <= iVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          goto LAB_0021ff42;
        }
        local_4d0.memused = 0;
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
        local_550 = pcVar18->exp;
        local_54c = pcVar18->neg;
        local_548 = pcVar18->fpclass;
        iStack_544 = pcVar18->prec_elem;
        local_578 = *(_func_int ***)(pcVar18->data)._M_elems;
        iStack_570 = (pcVar18->data)._M_elems[2];
        iStack_56c = (pcVar18->data)._M_elems[3];
        local_568 = *(int **)((pcVar18->data)._M_elems + 4);
        auStack_560 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
        local_558 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
        local_588 = pcVar18->exp;
        local_584 = pcVar18->neg;
        local_580._0_4_ = pcVar18->fpclass;
        local_580._4_4_ = pcVar18->prec_elem;
        local_5b0 = *(uint (*) [2])(pcVar18->data)._M_elems;
        auStack_5a8 = *(uint (*) [2])((pcVar18->data)._M_elems + 2);
        local_5a0 = *(uint (*) [2])((pcVar18->data)._M_elems + 4);
        auStack_598 = *(uint (*) [2])((pcVar18->data)._M_elems + 6);
        local_590 = *(uint (*) [2])((pcVar18->data)._M_elems + 8);
        ::soplex::infinity::__tls_init();
        local_678._0_4_ = cpp_dec_float_finite;
        local_678._4_4_ = 10;
        local_6a8 = ZEXT816(0);
        local_698 = (int *)0x0;
        uStack_690._0_1_ = false;
        stack0xfffffffffffff971 = 0;
        uStack_68b = 0;
        _local_688 = 0;
        uStack_683 = 0;
        local_680 = 0;
        local_67c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
        local_5c8[1]._1_3_ = uStack_683;
        local_5c8._0_5_ = _local_688;
        local_5d8 = local_698;
        uStack_5d0._0_1_ = uStack_690._0_1_;
        stack0xfffffffffffffa31 = stack0xfffffffffffff971;
        uStack_5cb = uStack_68b;
        local_5e8 = local_6a8;
        local_5c8[2] = local_680;
        local_5bc = local_67c;
        local_5b8._0_4_ = (fpclass_type)local_678;
        local_5b8._4_4_ = local_678._4_4_;
        if (local_38._0_1_ == true) {
          if (local_5f0 != (DIdxSet *)0x0) {
            iVar14 = NameSet::number(pNVar12,(char *)local_4a8);
            DIdxSet::addIdx(local_5f0,iVar14);
          }
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::one();
          local_5c8[2] = pcVar18->exp;
          local_5bc = pcVar18->neg;
          local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          _uStack_5d0 = (undefined5)uVar5;
          uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
          local_5b8._0_4_ = pcVar18->fpclass;
          local_5b8._4_4_ = pcVar18->prec_elem;
        }
      }
      dVar22 = atof((char *)local_258._8_8_);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_668,dVar22);
      uVar5 = local_258._0_8_;
      iVar14 = strcmp((char *)local_258._0_8_,local_138);
      auVar11 = local_668;
      if (iVar14 == 0) {
        local_558[0] = local_648[0];
        local_558[1] = local_648[1];
        auStack_560[1]._1_3_ = uStack_64b;
        auStack_560[0]._0_1_ = uStack_650._0_1_;
        auStack_560._1_4_ = uStack_650._1_4_;
        local_568 = local_658;
        local_578 = (_func_int **)local_668._0_8_;
        iStack_570 = local_668._8_4_;
        iStack_56c = local_668._12_4_;
        local_550 = local_648[2];
        local_54c = local_63c;
        local_548 = (fpclass_type)local_638;
        iStack_544 = local_638._4_4_;
        local_668 = auVar11;
      }
      else {
        iVar14 = NameSet::number(this_01,(char *)uVar5);
        if (iVar14 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"Column",pcStack_260,"row",(char *)local_258._0_8_);
        }
        else {
          if ((fpclass_type)local_638 != cpp_dec_float_NaN) {
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
            _local_688 = (undefined5)uVar5;
            uStack_683 = (undefined3)((ulong)uVar5 >> 0x28);
            local_6a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
            local_698 = *(int **)((pcVar18->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
            _uStack_690 = (undefined5)uVar5;
            uStack_68b = (undefined3)((ulong)uVar5 >> 0x28);
            local_680 = pcVar18->exp;
            local_67c = pcVar18->neg;
            local_678._0_4_ = pcVar18->fpclass;
            local_678._4_4_ = pcVar18->prec_elem;
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,
                                (cpp_dec_float<50U,_int,_void> *)local_6a8);
            if (iVar15 == 0) goto LAB_0021fd28;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4d8,iVar14,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_668);
        }
      }
LAB_0021fd28:
      if ((char *)local_248._8_8_ != (char *)0x0) {
        dVar22 = atof((char *)local_248._8_8_);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,dVar22);
        uVar5 = local_248._0_8_;
        iVar14 = strcmp((char *)local_248._0_8_,local_138);
        auVar11 = local_668;
        if (iVar14 == 0) {
          local_558[0] = local_648[0];
          local_558[1] = local_648[1];
          auStack_560[1]._1_3_ = uStack_64b;
          auStack_560[0]._0_1_ = uStack_650._0_1_;
          auStack_560._1_4_ = uStack_650._1_4_;
          local_568 = local_658;
          local_578 = (_func_int **)local_668._0_8_;
          iStack_570 = local_668._8_4_;
          iStack_56c = local_668._12_4_;
          local_550 = local_648[2];
          local_54c = local_63c;
          local_548 = (fpclass_type)local_638;
          iStack_544 = local_638._4_4_;
          local_668 = auVar11;
          goto LAB_0021f951;
        }
        iVar14 = NameSet::number(this_01,(char *)uVar5);
        if (-1 < iVar14) {
          if ((fpclass_type)local_638 != cpp_dec_float_NaN) {
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
            _local_688 = (undefined5)uVar5;
            uStack_683 = (undefined3)((ulong)uVar5 >> 0x28);
            local_6a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
            local_698 = *(int **)((pcVar18->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
            _uStack_690 = (undefined5)uVar5;
            uStack_68b = (undefined3)((ulong)uVar5 >> 0x28);
            local_680 = pcVar18->exp;
            local_67c = pcVar18->neg;
            local_678._0_4_ = pcVar18->fpclass;
            local_678._4_4_ = pcVar18->prec_elem;
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,
                                (cpp_dec_float<50U,_int,_void> *)local_6a8);
            if (iVar15 == 0) goto LAB_0021f951;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4d8,iVar14,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_668);
          goto LAB_0021f951;
        }
        MPSInput::entryIgnored
                  ((MPSInput *)local_390,"Column",pcStack_260,"row",(char *)local_248._0_8_);
      }
      goto LAB_0021f951;
    }
LAB_0021ff42:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_0021ff56:
    local_4d8 = (undefined1  [8])&PTR__DSVectorBase_006a0f40;
    if (local_4c0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_4c0);
    }
    local_540[0] = &PTR__DSVectorBase_006a0f40;
    if (local_528 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_528);
    }
  }
  pNVar12 = local_610;
  if (local_390._8_4_ == RHS) {
    pSVar6 = this->spxout;
    memset((DataKey *)local_4a8,0,0x100);
    memset(local_5e8,0,0x100);
    local_678._0_4_ = cpp_dec_float_finite;
    local_678._4_4_ = 10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (int *)0x0;
    uStack_690._0_1_ = false;
    stack0xfffffffffffff971 = 0;
    uStack_68b = 0;
    _local_688 = 0;
    uStack_683 = 0;
    local_680 = 0;
    local_67c = false;
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar13) {
      local_608 = *(double *)(in_FS_OFFSET + -8);
      uStack_600 = 0;
      local_628 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((ulong)local_608 ^ 0x8000000000000000);
      uStack_620 = 0x8000000000000000;
      while ((char *)local_390._296_8_ == (char *)0x0) {
        if (((char *)local_258._0_8_ != (char *)0x0 && (char *)local_258._8_8_ == (char *)0x0) ||
           (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))) {
          MPSInput::insertName((MPSInput *)local_390,"_RHS_",false);
        }
        if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
           ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0022070e;
        pcVar17 = pcStack_260;
        if (local_4a8[0] == '\0') {
          spxSnprintf((char *)local_4a8,0x100,"%s",pcStack_260);
          pcVar17 = pcStack_260;
        }
        iVar14 = strcmp((char *)local_4a8,pcVar17);
        if (iVar14 == 0) {
          uVar16 = NameSet::number(pNVar12,(char *)local_258._0_8_);
          if ((int)uVar16 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"RHS",pcStack_260,"row",(char *)local_258._0_8_);
          }
          else {
            dVar22 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,dVar22);
            pcVar18 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
            ::soplex::infinity::__tls_init();
            local_638._0_4_ = cpp_dec_float_finite;
            local_638._4_4_ = 10;
            local_668 = (undefined1  [16])0x0;
            local_658 = (int *)0x0;
            uStack_650._0_1_ = false;
            uStack_650._1_4_ = 0;
            uStack_64b = 0;
            local_648[0] = 0;
            local_648[1] = 0;
            local_648[2] = 0;
            local_63c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_668,local_608);
            if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
               auVar11 = local_6a8, local_6a8 = auVar11, iVar14 < 0)) {
              pnVar20 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                   CONCAT35(uStack_683,_local_688);
              puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
              *(int **)puVar3 = local_698;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
              pDVar2 = (DataKey *)(pnVar20 + uVar16);
              pDVar2->info = local_6a8._0_4_;
              pDVar2->idx = local_6a8._4_4_;
              pDVar2[1].info = local_6a8._8_4_;
              pDVar2[1].idx = local_6a8._12_4_;
              pnVar20[uVar16].m_backend.exp = local_680;
              pnVar20[uVar16].m_backend.neg = local_67c;
              pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
              pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
            }
            pcVar18 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
            ::soplex::infinity::__tls_init();
            local_638._0_4_ = cpp_dec_float_finite;
            local_638._4_4_ = 10;
            local_668 = (undefined1  [16])0x0;
            local_658 = (int *)0x0;
            uStack_650._0_1_ = false;
            uStack_650._1_4_ = 0;
            uStack_64b = 0;
            local_648[0] = 0;
            local_648[1] = 0;
            local_648[2] = 0;
            local_63c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_668,(double)local_628);
            if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
               auVar11 = local_6a8, local_6a8 = auVar11, 0 < iVar14)) {
              pnVar20 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                   CONCAT35(uStack_683,_local_688);
              puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
              *(int **)puVar3 = local_698;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
              pDVar2 = (DataKey *)(pnVar20 + uVar16);
              pDVar2->info = local_6a8._0_4_;
              pDVar2->idx = local_6a8._4_4_;
              pDVar2[1].info = local_6a8._8_4_;
              pDVar2[1].idx = local_6a8._12_4_;
              pnVar20[uVar16].m_backend.exp = local_680;
              pnVar20[uVar16].m_backend.neg = local_67c;
              pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
              pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
            }
          }
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar16 = NameSet::number(pNVar12,(char *)local_248._0_8_);
            if ((int)uVar16 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"RHS",pcStack_260,"row",(char *)local_248._0_8_);
            }
            else {
              dVar22 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6a8,dVar22);
              pcVar18 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,local_608);
              if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
                 auVar11 = local_6a8, local_6a8 = auVar11, iVar14 < 0)) {
                pnVar20 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                     CONCAT35(uStack_683,_local_688);
                puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
                *(int **)puVar3 = local_698;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
                pDVar2 = (DataKey *)(pnVar20 + uVar16);
                pDVar2->info = local_6a8._0_4_;
                pDVar2->idx = local_6a8._4_4_;
                pDVar2[1].info = local_6a8._8_4_;
                pDVar2[1].idx = local_6a8._12_4_;
                pnVar20[uVar16].m_backend.exp = local_680;
                pnVar20[uVar16].m_backend.neg = local_67c;
                pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
                pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
              }
              pcVar18 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,(double)local_628);
              if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
                 auVar11 = local_6a8, local_6a8 = auVar11, 0 < iVar14)) {
                pnVar20 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                     CONCAT35(uStack_683,_local_688);
                puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
                *(int **)puVar3 = local_698;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
                pDVar2 = (DataKey *)(pnVar20 + uVar16);
                pDVar2->info = local_6a8._0_4_;
                pDVar2->idx = local_6a8._4_4_;
                pDVar2[1].info = local_6a8._8_4_;
                pDVar2[1].idx = local_6a8._12_4_;
                pnVar20[uVar16].m_backend.exp = local_680;
                pnVar20[uVar16].m_backend.neg = local_67c;
                pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
                pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
              }
            }
          }
        }
        else {
          iVar14 = strcmp(local_5e8,pcVar17);
          if (((iVar14 != 0) && (spxSnprintf(local_5e8,0x100,"%s",pcVar17), pSVar6 != (SPxOut *)0x0)
              ) && (4 < (int)pSVar6->m_verbosity)) {
            local_668._0_4_ = pSVar6->m_verbosity;
            local_4d8._0_4_ = 5;
            (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_4d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar7 = pSVar6->m_streams[pSVar6->m_verbosity];
            sVar19 = strlen(local_5e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_5e8,sVar19);
            cVar4 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar4
                           );
            std::ostream::put(cVar4);
            std::ostream::flush();
            (*pSVar6->_vptr_SPxOut[2])(pSVar6);
          }
        }
        bVar13 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar13) goto LAB_0022070e;
      }
      pcVar17 = (char *)local_390._296_8_;
      if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
        local_668._0_4_ = pSVar6->m_verbosity;
        local_4d8._0_4_ = 4;
        (*pSVar6->_vptr_SPxOut[2])(pSVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar7 = pSVar6->m_streams[pSVar6->m_verbosity];
        sVar19 = strlen((char *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar19);
        cVar4 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_668);
        pcVar17 = (char *)local_390._296_8_;
      }
      iVar14 = strcmp(pcVar17,"RANGES");
      if (iVar14 == 0) {
        local_390._8_4_ = RANGES;
        goto LAB_00220722;
      }
      iVar14 = strcmp(pcVar17,"BOUNDS");
      if (iVar14 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_00220722;
      }
      iVar14 = strcmp(pcVar17,"ENDATA");
      if (iVar14 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_00220722;
      }
    }
LAB_0022070e:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_00220722:
  pNVar12 = local_610;
  if (local_390._8_4_ == RANGES) {
    pSVar6 = this->spxout;
    memset((DataKey *)local_4a8,0,0x100);
    local_678._0_4_ = cpp_dec_float_finite;
    local_678._4_4_ = 10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (int *)0x0;
    uStack_690._0_1_ = false;
    stack0xfffffffffffff971 = 0;
    uStack_68b = 0;
    _local_688 = 0;
    uStack_683 = 0;
    local_680 = 0;
    local_67c = false;
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    local_4e8 = pSVar6;
    if (bVar13) {
      pVVar1 = &(this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left;
      local_3a8 = *(double *)(in_FS_OFFSET + -8);
      uStack_3a0 = 0;
      local_608 = -local_3a8;
      uStack_600 = 0x8000000000000000;
      local_628 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right;
      while (pSVar6 = local_4e8, (char *)local_390._296_8_ == (char *)0x0) {
        if (((char *)local_258._0_8_ != (char *)0x0 && (char *)local_258._8_8_ == (char *)0x0) ||
           (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))) {
          MPSInput::insertName((MPSInput *)local_390,"_RNG_",false);
        }
        if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
           ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_002212f5;
        if (local_4a8[0] == '\0') {
          spxSnprintf((char *)local_4a8,0x100,"%s");
        }
        iVar14 = strcmp((char *)local_4a8,pcStack_260);
        if (iVar14 == 0) {
          uVar16 = NameSet::number(pNVar12,(char *)local_258._0_8_);
          if ((int)uVar16 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"Range",pcStack_260,"row",(char *)local_258._0_8_);
          }
          else {
            dVar22 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,dVar22);
            pcVar18 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
            ::soplex::infinity::__tls_init();
            local_5b8._0_4_ = cpp_dec_float_finite;
            local_5b8._4_4_ = 10;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (int *)0x0;
            uStack_5d0._0_1_ = false;
            stack0xfffffffffffffa31 = 0;
            uStack_5cb = 0;
            local_5c8[0] = 0;
            local_5c8[1] = 0;
            local_5c8[2] = 0;
            local_5bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_5e8,local_608);
            if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_5b8 != cpp_dec_float_NaN)) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_5e8), 0 < iVar14)
               ) {
              pcVar18 = &(local_628->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              ::soplex::infinity::__tls_init();
              local_638._0_4_ = cpp_dec_float_finite;
              local_638._4_4_ = 10;
              local_668 = (undefined1  [16])0x0;
              local_658 = (int *)0x0;
              uStack_650._0_1_ = false;
              uStack_650._1_4_ = 0;
              uStack_64b = 0;
              local_648[0] = 0;
              local_648[1] = 0;
              local_648[2] = 0;
              local_63c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_668,local_3a8);
              if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
                 iVar14 < 0)) {
                if ((fpclass_type)local_678 == cpp_dec_float_NaN) {
LAB_0022117a:
                  pVVar21 = pVVar1;
                }
                else {
                  local_5b8._0_4_ = cpp_dec_float_finite;
                  local_5b8._4_4_ = 10;
                  local_5e8 = (undefined1  [16])0x0;
                  local_5d8 = (int *)0x0;
                  uStack_5d0._0_1_ = false;
                  stack0xfffffffffffffa31 = 0;
                  uStack_5cb = 0;
                  local_5c8[0] = 0;
                  local_5c8[1] = 0;
                  local_5c8[2] = 0;
                  local_5bc = false;
                  iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                      (cpp_dec_float<50U,_int,_void> *)local_5e8);
                  pVVar21 = local_628;
                  if (iVar14 < 0) goto LAB_0022117a;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(pVVar21->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)local_6a8);
                goto LAB_00220cf2;
              }
            }
            pcVar18 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
            ::soplex::infinity::__tls_init();
            local_5b8._0_4_ = cpp_dec_float_finite;
            local_5b8._4_4_ = 10;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (int *)0x0;
            _uStack_5d0 = 0;
            uStack_5cb = 0;
            local_5c8[0] = 0;
            local_5c8[1] = 0;
            local_5c8[2] = 0;
            local_5bc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_5e8,local_608);
            if (((pcVar18->fpclass == cpp_dec_float_NaN) ||
                ((fpclass_type)local_5b8 == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_5e8), iVar14 < 1)
               ) {
              pcVar18 = &(local_628->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              local_648[1]._1_3_ = uStack_683;
              local_648._0_5_ = _local_688;
              local_658 = local_698;
              uStack_650._0_1_ = uStack_690._0_1_;
              uStack_650._1_4_ = stack0xfffffffffffff971;
              uStack_64b = uStack_68b;
              local_668 = local_6a8;
              auVar11 = local_668;
              local_648[2] = local_680;
              local_63c = local_67c;
              local_638._0_4_ = (fpclass_type)local_678;
              local_638._4_4_ = local_678._4_4_;
              if ((local_67c == true) &&
                 (local_668._0_4_ = local_6a8._0_4_,
                 (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                local_63c = false;
              }
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8[0] = 0;
              local_5c8[1] = 0;
              local_5c8[2] = 0;
              local_5bc = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar18) {
                local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                _uStack_5d0 = (undefined5)uVar5;
                uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
                local_5c8[2] = pcVar18->exp;
                local_5bc = pcVar18->neg;
                local_5b8._0_4_ = pcVar18->fpclass;
                local_5b8._4_4_ = pcVar18->prec_elem;
              }
              local_668 = auVar11;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                         (cpp_dec_float<50U,_int,_void> *)local_668);
              pnVar20 = (pVVar1->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pcVar18 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              local_648[1]._1_3_ = uStack_683;
              local_648._0_5_ = _local_688;
              local_658 = local_698;
              uStack_650._0_1_ = uStack_690._0_1_;
              uStack_650._1_4_ = stack0xfffffffffffff971;
              uStack_64b = uStack_68b;
              local_668 = local_6a8;
              auVar11 = local_668;
              local_648[2] = local_680;
              local_63c = local_67c;
              local_638._0_4_ = (fpclass_type)local_678;
              local_638._4_4_ = local_678._4_4_;
              if ((local_67c == true) &&
                 (local_668._0_4_ = local_6a8._0_4_,
                 (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                local_63c = false;
              }
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8[0] = 0;
              local_5c8[1] = 0;
              local_5c8[2] = 0;
              local_5bc = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar18) {
                local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                _uStack_5d0 = (undefined5)uVar5;
                uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
                local_5c8[2] = pcVar18->exp;
                local_5bc = pcVar18->neg;
                local_5b8._0_4_ = pcVar18->fpclass;
                local_5b8._4_4_ = pcVar18->prec_elem;
              }
              local_668 = auVar11;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                         (cpp_dec_float<50U,_int,_void> *)local_668);
              pnVar20 = (local_628->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            auVar11 = local_5e8;
            *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) = local_5c8._0_8_;
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(int **)puVar3 = local_5d8;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
            pDVar2 = (DataKey *)(pnVar20 + uVar16);
            pDVar2->info = local_5e8._0_4_;
            pDVar2->idx = local_5e8._4_4_;
            pDVar2[1].info = local_5e8._8_4_;
            pDVar2[1].idx = local_5e8._12_4_;
            pnVar20[uVar16].m_backend.exp = local_5c8[2];
            pnVar20[uVar16].m_backend.neg = local_5bc;
            pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_5b8;
            pnVar20[uVar16].m_backend.prec_elem = local_5b8._4_4_;
            local_5e8 = auVar11;
          }
LAB_00220cf2:
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar16 = NameSet::number(pNVar12,(char *)local_248._0_8_);
            if ((int)uVar16 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"Range",pcStack_260,"row",(char *)local_248._0_8_);
            }
            else {
              dVar22 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6a8,dVar22);
              pcVar18 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              ::soplex::infinity::__tls_init();
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (int *)0x0;
              uStack_5d0._0_1_ = false;
              stack0xfffffffffffffa31 = 0;
              uStack_5cb = 0;
              local_5c8[0] = 0;
              local_5c8[1] = 0;
              local_5c8[2] = 0;
              local_5bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,local_608);
              if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_5b8 != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_5e8),
                 0 < iVar14)) {
                pcVar18 = &(local_628->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
                ::soplex::infinity::__tls_init();
                local_638._0_4_ = cpp_dec_float_finite;
                local_638._4_4_ = 10;
                local_668 = (undefined1  [16])0x0;
                local_658 = (int *)0x0;
                uStack_650._0_1_ = false;
                uStack_650._1_4_ = 0;
                uStack_64b = 0;
                local_648[0] = 0;
                local_648[1] = 0;
                local_648[2] = 0;
                local_63c = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_668,local_3a8);
                if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_668),
                   iVar14 < 0)) {
                  if ((fpclass_type)local_678 == cpp_dec_float_NaN) {
LAB_002211e3:
                    pVVar21 = pVVar1;
                  }
                  else {
                    local_5b8._0_4_ = cpp_dec_float_finite;
                    local_5b8._4_4_ = 10;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8 = (int *)0x0;
                    uStack_5d0._0_1_ = false;
                    stack0xfffffffffffffa31 = 0;
                    uStack_5cb = 0;
                    local_5c8[0] = 0;
                    local_5c8[1] = 0;
                    local_5c8[2] = 0;
                    local_5bc = false;
                    iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)local_6a8,
                                        (cpp_dec_float<50U,_int,_void> *)local_5e8);
                    pVVar21 = local_628;
                    if (iVar14 < 0) goto LAB_002211e3;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&(pVVar21->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend,
                             (cpp_dec_float<50U,_int,_void> *)local_6a8);
                  goto LAB_002208bd;
                }
              }
              pcVar18 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
              ::soplex::infinity::__tls_init();
              local_5b8._0_4_ = cpp_dec_float_finite;
              local_5b8._4_4_ = 10;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = (int *)0x0;
              _uStack_5d0 = 0;
              uStack_5cb = 0;
              local_5c8[0] = 0;
              local_5c8[1] = 0;
              local_5c8[2] = 0;
              local_5bc = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,local_608);
              if (((pcVar18->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_5b8 == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_5e8),
                 iVar14 < 1)) {
                pcVar18 = &(local_628->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
                local_648[1]._1_3_ = uStack_683;
                local_648._0_5_ = _local_688;
                local_658 = local_698;
                uStack_650._0_1_ = uStack_690._0_1_;
                uStack_650._1_4_ = stack0xfffffffffffff971;
                uStack_64b = uStack_68b;
                local_668 = local_6a8;
                auVar11 = local_668;
                local_648[2] = local_680;
                local_63c = local_67c;
                local_638._0_4_ = (fpclass_type)local_678;
                local_638._4_4_ = local_678._4_4_;
                if ((local_67c == true) &&
                   (local_668._0_4_ = local_6a8._0_4_,
                   (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                  local_63c = false;
                }
                local_5b8._0_4_ = cpp_dec_float_finite;
                local_5b8._4_4_ = 10;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (int *)0x0;
                uStack_5d0._0_1_ = false;
                stack0xfffffffffffffa31 = 0;
                uStack_5cb = 0;
                local_5c8[0] = 0;
                local_5c8[1] = 0;
                local_5c8[2] = 0;
                local_5bc = false;
                if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar18) {
                  local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                  local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
                  uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  _uStack_5d0 = (undefined5)uVar5;
                  uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
                  local_5c8[2] = pcVar18->exp;
                  local_5bc = pcVar18->neg;
                  local_5b8._0_4_ = pcVar18->fpclass;
                  local_5b8._4_4_ = pcVar18->prec_elem;
                }
                local_668 = auVar11;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                           (cpp_dec_float<50U,_int,_void> *)local_668);
                pnVar20 = (pVVar1->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                pcVar18 = &(pVVar1->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].m_backend;
                local_648[1]._1_3_ = uStack_683;
                local_648._0_5_ = _local_688;
                local_658 = local_698;
                uStack_650._0_1_ = uStack_690._0_1_;
                uStack_650._1_4_ = stack0xfffffffffffff971;
                uStack_64b = uStack_68b;
                local_668 = local_6a8;
                auVar11 = local_668;
                local_648[2] = local_680;
                local_63c = local_67c;
                local_638._0_4_ = (fpclass_type)local_678;
                local_638._4_4_ = local_678._4_4_;
                if ((local_67c == true) &&
                   (local_668._0_4_ = local_6a8._0_4_,
                   (fpclass_type)local_678 != cpp_dec_float_finite || local_668._0_4_ != 0)) {
                  local_63c = false;
                }
                local_5b8._0_4_ = cpp_dec_float_finite;
                local_5b8._4_4_ = 10;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (int *)0x0;
                uStack_5d0._0_1_ = false;
                stack0xfffffffffffffa31 = 0;
                uStack_5cb = 0;
                local_5c8[0] = 0;
                local_5c8[1] = 0;
                local_5c8[2] = 0;
                local_5bc = false;
                if ((cpp_dec_float<50U,_int,_void> *)local_5e8 != pcVar18) {
                  local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
                  local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
                  uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  _uStack_5d0 = (undefined5)uVar5;
                  uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
                  local_5c8[2] = pcVar18->exp;
                  local_5bc = pcVar18->neg;
                  local_5b8._0_4_ = pcVar18->fpclass;
                  local_5b8._4_4_ = pcVar18->prec_elem;
                }
                local_668 = auVar11;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)local_5e8,
                           (cpp_dec_float<50U,_int,_void> *)local_668);
                pnVar20 = (local_628->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              auVar11 = local_5e8;
              *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) = local_5c8._0_8_;
              puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
              *(int **)puVar3 = local_5d8;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
              pDVar2 = (DataKey *)(pnVar20 + uVar16);
              pDVar2->info = local_5e8._0_4_;
              pDVar2->idx = local_5e8._4_4_;
              pDVar2[1].info = local_5e8._8_4_;
              pDVar2[1].idx = local_5e8._12_4_;
              pnVar20[uVar16].m_backend.exp = local_5c8[2];
              pnVar20[uVar16].m_backend.neg = local_5bc;
              pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_5b8;
              pnVar20[uVar16].m_backend.prec_elem = local_5b8._4_4_;
              local_5e8 = auVar11;
            }
          }
        }
LAB_002208bd:
        bVar13 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar13) goto LAB_002212f5;
      }
      pcVar17 = (char *)local_390._296_8_;
      if ((local_4e8 != (SPxOut *)0x0) && (3 < (int)local_4e8->m_verbosity)) {
        local_5e8._0_4_ = local_4e8->m_verbosity;
        local_668._0_4_ = 4;
        (*local_4e8->_vptr_SPxOut[2])(local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar7 = pSVar6->m_streams[pSVar6->m_verbosity];
        sVar19 = strlen((char *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar19);
        cVar4 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_5e8);
        pcVar17 = (char *)local_390._296_8_;
      }
      iVar14 = strcmp(pcVar17,"BOUNDS");
      if (iVar14 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_00221309;
      }
      iVar14 = strcmp(pcVar17,"ENDATA");
      if (iVar14 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_00221309;
      }
    }
LAB_002212f5:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_00221309:
  pNVar12 = local_630;
  if (local_390._8_4_ == BOUNDS) {
    pSVar6 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_668,8);
    memset((DataKey *)local_4a8,0,0x100);
    local_5b8._0_4_ = cpp_dec_float_finite;
    local_5b8._4_4_ = 10;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8 = (int *)0x0;
    uStack_5d0._0_1_ = false;
    stack0xfffffffffffffa31 = 0;
    uStack_5cb = 0;
    local_5c8[0] = 0;
    local_5c8[1] = 0;
    local_5c8[2] = 0;
    local_5bc = false;
    local_608 = *(double *)(in_FS_OFFSET + -8);
    uStack_600 = 0;
    local_628 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((ulong)local_608 ^ 0x8000000000000000);
    uStack_620 = 0x8000000000000000;
LAB_002213aa:
    bVar13 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar13) {
      if ((char *)local_390._296_8_ != (char *)0x0) {
        if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
          local_6a8._0_4_ = pSVar6->m_verbosity;
          local_4d8._0_4_ = 4;
          (*pSVar6->_vptr_SPxOut[2])(pSVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar7 = pSVar6->m_streams[pSVar6->m_verbosity];
          sVar19 = strlen((char *)local_4a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_4a8,sVar19);
          cVar4 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_6a8);
        }
        iVar14 = strcmp((char *)local_390._296_8_,"ENDATA");
        if (iVar14 == 0) {
          local_390._8_4_ = ENDATA;
          goto LAB_00221cec;
        }
        goto switchD_00221811_caseD_4e;
      }
      cVar4 = *pcStack_260;
      if (cVar4 == 'F') {
        if (pcStack_260[1] == 'X') goto LAB_0022140b;
LAB_00221415:
        pcVar17 = (char *)local_258._8_8_;
        if ((char *)local_258._0_8_ != (char *)0x0) {
joined_r0x00221594:
          if (pcVar17 == (char *)0x0) {
            MPSInput::insertName((MPSInput *)local_390,"_BND_",true);
            if (pcStack_260 == (char *)0x0) goto switchD_00221811_caseD_4e;
          }
        }
      }
      else {
        if (cVar4 == 'U') {
          if ((pcStack_260[1] == 'I') || (pcStack_260[1] == 'P')) goto LAB_0022140b;
          goto LAB_00221415;
        }
        if ((cVar4 != 'L') || ((pcStack_260[1] != 'I' && (pcStack_260[1] != 'O'))))
        goto LAB_00221415;
LAB_0022140b:
        if (pcStack_260[2] != '\0') goto LAB_00221415;
        if ((char *)local_258._8_8_ != (char *)0x0) {
          pcVar17 = (char *)local_248._0_8_;
          goto joined_r0x00221594;
        }
      }
      if (((char *)local_258._0_8_ == (char *)0x0) || ((char *)local_258._8_8_ == (char *)0x0))
      goto switchD_00221811_caseD_4e;
      if (local_4a8[0] == '\0') {
        spxSnprintf((char *)local_4a8,0x100,"%s");
      }
      iVar14 = strcmp((char *)local_4a8,(char *)local_258._0_8_);
      if (iVar14 == 0) {
        uVar16 = NameSet::number(pNVar12,(char *)local_258._8_8_);
        if ((int)uVar16 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"column",(char *)local_258._8_8_,"bound",
                     (char *)local_4a8);
          goto LAB_002213aa;
        }
        uVar5 = local_248._0_8_;
        if ((char *)local_248._0_8_ == (char *)0x0) {
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_5c8._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          local_5e8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_5d8 = *(int **)((pcVar18->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          _uStack_5d0 = (undefined5)uVar5;
          uStack_5cb = (undefined3)((ulong)uVar5 >> 0x28);
          local_5c8[2] = pcVar18->exp;
          local_5bc = pcVar18->neg;
          local_5b8._0_4_ = pcVar18->fpclass;
          local_5b8._4_4_ = pcVar18->prec_elem;
        }
        else {
          iVar14 = strcmp((char *)local_248._0_8_,"-Inf");
          if ((iVar14 == 0) || (iVar14 = strcmp((char *)uVar5,"-inf"), iVar14 == 0)) {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_628);
          }
          else {
            iVar14 = strcmp((char *)uVar5,"Inf");
            if ((((iVar14 != 0) && (iVar14 = strcmp((char *)uVar5,"inf"), iVar14 != 0)) &&
                (iVar14 = strcmp((char *)uVar5,"+Inf"), iVar14 != 0)) &&
               (iVar14 = strcmp((char *)uVar5,"+inf"), iVar14 != 0)) {
              dVar22 = atof((char *)uVar5);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_5e8,dVar22);
              goto LAB_0022170d;
            }
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
          }
          local_5c8[1]._1_3_ = uStack_683;
          local_5c8._0_5_ = _local_688;
          local_5d8 = local_698;
          uStack_5d0._0_1_ = uStack_690._0_1_;
          stack0xfffffffffffffa31 = stack0xfffffffffffff971;
          uStack_5cb = uStack_68b;
          local_5e8 = local_6a8;
          local_5c8[2] = local_680;
          local_5bc = local_67c;
          local_5b8._0_4_ = (fpclass_type)local_678;
          local_5b8._4_4_ = local_678._4_4_;
        }
LAB_0022170d:
        if (pcStack_260[1] == 'I') {
          if (local_5f0 != (DIdxSet *)0x0) {
            DIdxSet::addIdx(local_5f0,uVar16);
          }
          iVar14 = IdxSet::pos((IdxSet *)local_668,uVar16);
          if (iVar14 < 0) {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
            auVar11 = local_6a8;
            pnVar20 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar20 + uVar16);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar20[uVar16].m_backend.exp = local_680;
            pnVar20[uVar16].m_backend.neg = local_67c;
            pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
            pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar11;
            DIdxSet::addIdx((DIdxSet *)local_668,uVar16);
          }
        }
        auVar11 = local_5e8;
        cVar4 = *pcStack_260;
        switch(cVar4) {
        case 'L':
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 'M':
          ::soplex::infinity::__tls_init();
          local_678._0_4_ = cpp_dec_float_finite;
          local_678._4_4_ = 10;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (int *)0x0;
          uStack_690._0_1_ = false;
          stack0xfffffffffffff971 = 0;
          uStack_68b = 0;
          _local_688 = 0;
          uStack_683 = 0;
          local_680 = 0;
          local_67c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_628);
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_002219c0;
        case 'N':
        case 'O':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
          goto switchD_00221811_caseD_4e;
        case 'P':
          ::soplex::infinity::__tls_init();
          local_678._0_4_ = cpp_dec_float_finite;
          local_678._4_4_ = 10;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (int *)0x0;
          uStack_690._0_1_ = false;
          stack0xfffffffffffff971 = 0;
          uStack_68b = 0;
          _local_688 = 0;
          uStack_683 = 0;
          local_680 = 0;
          local_67c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002219c0:
          auVar11 = local_6a8;
          *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) = CONCAT35(uStack_683,_local_688);
          puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
          *(int **)puVar3 = local_698;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
          pDVar2 = (DataKey *)(pnVar20 + uVar16);
          pDVar2->info = local_6a8._0_4_;
          pDVar2->idx = local_6a8._4_4_;
          pDVar2[1].info = local_6a8._8_4_;
          pDVar2[1].idx = local_6a8._12_4_;
          pnVar20[uVar16].m_backend.exp = local_680;
          pnVar20[uVar16].m_backend.neg = local_67c;
          pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
          pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
          local_6a8 = auVar11;
          goto LAB_002213aa;
        case 'U':
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          if (cVar4 == 'B') {
            pnVar20 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                 *(undefined8 *)((pcVar18->data)._M_elems + 8);
            uVar5 = *(undefined8 *)(pcVar18->data)._M_elems;
            uVar8 = *(undefined8 *)((pcVar18->data)._M_elems + 2);
            uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
            *(undefined8 *)(puVar3 + 2) = uVar9;
            *(undefined8 *)&pnVar20[uVar16].m_backend.data = uVar5;
            *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 2) = uVar8;
            pnVar20[uVar16].m_backend.exp = pcVar18->exp;
            pnVar20[uVar16].m_backend.neg = pcVar18->neg;
            iVar10 = pcVar18->prec_elem;
            pnVar20[uVar16].m_backend.fpclass = pcVar18->fpclass;
            pnVar20[uVar16].m_backend.prec_elem = iVar10;
            pnVar20 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::one();
            *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                 *(undefined8 *)((pcVar18->data)._M_elems + 8);
            uVar8 = *(undefined8 *)(pcVar18->data)._M_elems;
            uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 2);
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
            *(undefined8 *)(puVar3 + 2) = uVar5;
            *(undefined8 *)&pnVar20[uVar16].m_backend.data = uVar8;
            *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 2) = uVar9;
            pnVar20[uVar16].m_backend.exp = pcVar18->exp;
            pnVar20[uVar16].m_backend.neg = pcVar18->neg;
            iVar10 = pcVar18->prec_elem;
            pnVar20[uVar16].m_backend.fpclass = pcVar18->fpclass;
            pnVar20[uVar16].m_backend.prec_elem = iVar10;
            if (local_5f0 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_5f0,uVar16);
            }
            goto LAB_002213aa;
          }
          if (cVar4 != 'F') goto switchD_00221811_caseD_4e;
          if (pcStack_260[1] != 'X') {
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            _uStack_690 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,(double)local_628);
            auVar11 = local_6a8;
            pnVar20 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar20 + uVar16);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar20[uVar16].m_backend.exp = local_680;
            pnVar20[uVar16].m_backend.neg = local_67c;
            pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
            pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar11;
            ::soplex::infinity::__tls_init();
            local_678._0_4_ = cpp_dec_float_finite;
            local_678._4_4_ = 10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (int *)0x0;
            uStack_690._0_1_ = false;
            stack0xfffffffffffff971 = 0;
            uStack_68b = 0;
            _local_688 = 0;
            uStack_683 = 0;
            local_680 = 0;
            local_67c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6a8,local_608);
            auVar11 = local_6a8;
            pnVar20 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar20[uVar16].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_683,_local_688);
            puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
            *(int **)puVar3 = local_698;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_68b,_uStack_690);
            pDVar2 = (DataKey *)(pnVar20 + uVar16);
            pDVar2->info = local_6a8._0_4_;
            pDVar2->idx = local_6a8._4_4_;
            pDVar2[1].info = local_6a8._8_4_;
            pDVar2[1].idx = local_6a8._12_4_;
            pnVar20[uVar16].m_backend.exp = local_680;
            pnVar20[uVar16].m_backend.neg = local_67c;
            pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_678;
            pnVar20[uVar16].m_backend.prec_elem = local_678._4_4_;
            local_6a8 = auVar11;
            goto LAB_002213aa;
          }
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) = local_5c8._0_8_;
          puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
          *(int **)puVar3 = local_5d8;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
          pDVar2 = (DataKey *)(pnVar20 + uVar16);
          pDVar2->info = local_5e8._0_4_;
          pDVar2->idx = local_5e8._4_4_;
          pDVar2[1].info = local_5e8._8_4_;
          pDVar2[1].idx = local_5e8._12_4_;
          pnVar20[uVar16].m_backend.exp = local_5c8[2];
          pnVar20[uVar16].m_backend.neg = local_5bc;
          pnVar20[uVar16].m_backend.fpclass = (fpclass_type)local_5b8;
          pnVar20[uVar16].m_backend.prec_elem = local_5b8._4_4_;
          pnVar20 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        *(undefined8 *)(pnVar20[uVar16].m_backend.data._M_elems + 8) = local_5c8._0_8_;
        puVar3 = pnVar20[uVar16].m_backend.data._M_elems + 4;
        *(int **)puVar3 = local_5d8;
        *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,_uStack_5d0);
        pDVar2 = (DataKey *)(pnVar20 + uVar16);
        pDVar2->info = local_5e8._0_4_;
        pDVar2->idx = local_5e8._4_4_;
        pDVar2[1].info = local_5e8._8_4_;
        pDVar2[1].idx = local_5e8._12_4_;
        pnVar20[uVar16].m_backend.exp = local_5c8[2];
        pnVar20[uVar16].m_backend.neg = local_5bc;
        *(undefined8 *)&pnVar20[uVar16].m_backend.fpclass = local_5b8;
        local_5e8 = auVar11;
      }
      goto LAB_002213aa;
    }
switchD_00221811_caseD_4e:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_00221cec:
    DIdxSet::~DIdxSet((DIdxSet *)local_668);
  }
  if (local_390._8_4_ != ENDATA) {
    MPSInput::syntaxError((MPSInput *)local_390);
  }
  if ((bool)local_390[0x20] == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_390._28_4_ != MINIMIZE) - 1) +
                           (uint)(local_390._28_4_ != MINIMIZE)));
    pSVar6 = this->spxout;
    if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
      local_4a8._0_4_ = pSVar6->m_verbosity;
      local_5e8._0_4_ = 4;
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar17 = "Maximize\n";
      if (local_390._28_4_ == MINIMIZE) {
        pcVar17 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],pcVar17,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)local_4a8);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_4e0->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_4b8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_630);
    free(local_630);
    local_630 = (NameSet *)0x0;
  }
  if (local_4b0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_610);
    free(local_610);
  }
  return (bool)(local_390[0x20] ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}